

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.cpp
# Opt level: O2

vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_> *
dg::pta::getBasicBlocksInDominatorOrder
          (vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>
           *__return_storage_ptr__,Function *F)

{
  uint uVar1;
  long lVar2;
  pointer ppDVar3;
  pointer ppDVar4;
  pointer ppDVar5;
  size_type __n;
  pointer ppDVar6;
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  *__range3;
  long lVar7;
  _Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  local_f8;
  _Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  local_d8;
  DomTreeNodeBase<llvm::BasicBlock> *child;
  pointer local_b8;
  pointer local_b0;
  BasicBlock *local_a8;
  DomTreeNodeBase<llvm::BasicBlock> *root_node;
  DominatorTreeWrapperPass wrapper;
  undefined8 *local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = llvm::simple_ilist<llvm::BasicBlock>::size((simple_ilist<llvm::BasicBlock> *)(F + 0x48));
  std::vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>::reserve
            (__return_storage_ptr__,__n);
  llvm::DominatorTreeWrapperPass::DominatorTreeWrapperPass(&wrapper);
  llvm::DominatorTreeWrapperPass::runOnFunction((Function *)&wrapper);
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)*local_48;
  std::vector<llvm::BasicBlock_const*,std::allocator<llvm::BasicBlock_const*>>::
  emplace_back<llvm::BasicBlock_const*>
            ((vector<llvm::BasicBlock_const*,std::allocator<llvm::BasicBlock_const*>> *)
             __return_storage_ptr__,(BasicBlock **)&local_f8);
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  ::reserve((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
             *)&local_f8,4);
  std::
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  ::push_back((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
               *)&local_f8,&root_node);
  while( true ) {
    if (local_f8._M_impl.super__Vector_impl_data._M_start ==
        local_f8._M_impl.super__Vector_impl_data._M_finish) break;
    local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ::reserve((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
               *)&local_d8,
              (long)local_f8._M_impl.super__Vector_impl_data._M_finish -
              (long)local_f8._M_impl.super__Vector_impl_data._M_start >> 3);
    local_b8 = local_f8._M_impl.super__Vector_impl_data._M_finish;
    ppDVar6 = local_f8._M_impl.super__Vector_impl_data._M_start;
    while (ppDVar5 = local_f8._M_impl.super__Vector_impl_data._M_end_of_storage,
          ppDVar4 = local_f8._M_impl.super__Vector_impl_data._M_finish,
          ppDVar3 = local_f8._M_impl.super__Vector_impl_data._M_start, ppDVar6 != local_b8) {
      lVar2 = *(long *)(*ppDVar6 + 0x18);
      uVar1 = *(uint *)(*ppDVar6 + 0x20);
      local_b0 = ppDVar6;
      for (lVar7 = 0; (ulong)uVar1 << 3 != lVar7; lVar7 = lVar7 + 8) {
        child = *(DomTreeNodeBase<llvm::BasicBlock> **)(lVar2 + lVar7);
        std::
        vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
        ::push_back((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                     *)&local_d8,&child);
        local_a8 = *(BasicBlock **)child;
        std::vector<llvm::BasicBlock_const*,std::allocator<llvm::BasicBlock_const*>>::
        emplace_back<llvm::BasicBlock_const*>
                  ((vector<llvm::BasicBlock_const*,std::allocator<llvm::BasicBlock_const*>> *)
                   __return_storage_ptr__,&local_a8);
      }
      ppDVar6 = local_b0 + 1;
    }
    local_f8._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_d8._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_f8._M_impl.super__Vector_impl_data._M_start =
         local_d8._M_impl.super__Vector_impl_data._M_start;
    local_f8._M_impl.super__Vector_impl_data._M_finish =
         local_d8._M_impl.super__Vector_impl_data._M_finish;
    local_d8._M_impl.super__Vector_impl_data._M_start = ppDVar3;
    local_d8._M_impl.super__Vector_impl_data._M_finish = ppDVar4;
    local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = ppDVar5;
    std::
    _Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ::~_Vector_base(&local_d8);
  }
  std::
  _Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  ::~_Vector_base(&local_f8);
  llvm::DominatorTreeWrapperPass::~DominatorTreeWrapperPass(&wrapper);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const llvm::BasicBlock *>
getBasicBlocksInDominatorOrder(llvm::Function &F) {
    std::vector<const llvm::BasicBlock *> blocks;
    blocks.reserve(F.size());

#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 9))
    llvm::DominatorTree DTree;
    DTree.recalculate(F);
#else
    llvm::DominatorTreeWrapperPass wrapper;
    wrapper.runOnFunction(F);
    auto &DTree = wrapper.getDomTree();
#ifndef NDEBUG
    wrapper.verifyAnalysis();
#endif
#endif

    auto *root_node = DTree.getRootNode();
    blocks.push_back(root_node->getBlock());

    std::vector<llvm::DomTreeNode *> to_process;
    to_process.reserve(4);
    to_process.push_back(root_node);

    while (!to_process.empty()) {
        std::vector<llvm::DomTreeNode *> new_to_process;
        new_to_process.reserve(to_process.size());

        for (auto *cur_node : to_process) {
            for (auto *child : *cur_node) {
                new_to_process.push_back(child);
                blocks.push_back(child->getBlock());
            }
        }

        to_process.swap(new_to_process);
    }

    return blocks;
}